

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_encoder.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::
basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::write_string_value
          (basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
           *this,string_view_type *value,string_type *str)

{
  string_type *sink;
  char_type *pcVar1;
  char_type *pcVar2;
  undefined8 in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  char_type *in_RDI;
  basic_csv_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *unaff_retaddr;
  bool quote;
  size_t length;
  char *s;
  uint7 in_stack_ffffffffffffffd0;
  byte bVar3;
  char_type *s_00;
  
  s_00 = in_RDI;
  sink = (string_type *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
  pcVar1 = (char_type *)std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
  bVar3 = 0;
  if ((in_RDI[0x48] != '\x01') && (in_RDI[0x48] != '\x02')) {
    if (in_RDI[0x48] != '\0') goto LAB_0043aa11;
    pcVar2 = std::char_traits<char>::find(pcVar1,(ulong)in_stack_ffffffffffffffd0,in_RDI);
    if (pcVar2 == (char_type *)0x0) {
      pcVar1 = std::char_traits<char>::find(pcVar1,CONCAT17(bVar3,in_stack_ffffffffffffffd0),in_RDI)
      ;
      if (pcVar1 == (char_type *)0x0) goto LAB_0043aa11;
    }
  }
  bVar3 = 1;
  std::__cxx11::string::push_back((char)in_RDX);
LAB_0043aa11:
  escape_string(unaff_retaddr,s_00,(size_t)in_RSI,(char)((ulong)in_RDX >> 0x38),
                (char)((ulong)in_RDX >> 0x30),sink);
  if ((bVar3 & 1) != 0) {
    std::__cxx11::string::push_back((char)in_RDX);
  }
  return;
}

Assistant:

void write_string_value(const string_view_type& value, string_type& str)
    {
        const char* s = value.data();
        const std::size_t length = value.length();
        
        bool quote = false;
        if (quote_style_ == quote_style_kind::all || quote_style_ == quote_style_kind::nonnumeric ||
            (quote_style_ == quote_style_kind::minimal &&
            (std::char_traits<CharT>::find(s, length, field_delimiter_) != nullptr || std::char_traits<CharT>::find(s, length, quote_char_) != nullptr)))
        {
            quote = true;
            str.push_back(quote_char_);
        }
        escape_string(s, length, quote_char_, quote_escape_char_, str);
        if (quote)
        {
            str.push_back(quote_char_);
        }
    }